

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microtar.c
# Opt level: O0

int mtar_finalize(mtar_t *tar)

{
  int iVar1;
  mtar_t *tar_local;
  
  iVar1 = mtar_write_null_bytes(tar,0x400);
  return iVar1;
}

Assistant:

int mtar_finalize(mtar_t *tar) {
  /* Write two NULL records */
  return mtar_write_null_bytes(tar, sizeof(mtar_raw_header_t) * 2);
}